

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

char * parse_hdr_field(VrplibParser *p,char *fieldname)

{
  bool bVar1;
  long lVar2;
  _Bool _Var3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  
  _Var3 = parser_match_string(p,fieldname);
  if (_Var3) {
    parser_eat_whitespaces(p);
    _Var3 = parser_match_string(p,":");
    if (_Var3) {
      pcVar4 = p->at;
      pcVar5 = pcVar4;
      while (((lVar2 = (long)p->base - (long)pcVar5, lVar2 != -p->size && (*pcVar5 != '\n')) &&
             (*pcVar5 != '\r'))) {
        pcVar5 = pcVar5 + (lVar2 != -p->size);
        p->at = pcVar5;
      }
      _Var3 = parser_match_newline(p);
      if (_Var3) {
        __n = (long)pcVar5 - (long)pcVar4;
        if (0 < (long)__n) {
          do {
            if ((pcVar4[__n - 1] != ' ') && (pcVar4[__n - 1] != '\t')) goto LAB_00104bf5;
            bVar1 = 1 < (long)__n;
            __n = __n - 1;
          } while (bVar1);
          __n = 0;
        }
LAB_00104bf5:
        pcVar5 = (char *)malloc(__n + 1);
        pcVar5[__n] = '\0';
        pcVar4 = strncpy(pcVar5,pcVar4,__n);
        return pcVar4;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *parse_hdr_field(VrplibParser *p, char *fieldname) {
    if (parser_match_string(p, fieldname)) {
        parser_eat_whitespaces(p);

        if (parser_match_string(p, ":")) {
            char *at = p->at;

            while (!parser_is_eof(p)) {
                bool is_newline = (*p->at == '\r' || *p->at == '\n');
                if (is_newline) {
                    break;
                }
                parser_adv(p, 1);
            }

            ptrdiff_t namesize = p->at - at;

            // Match end of line
            if (!parser_match_newline(p)) {
                return NULL;
            }

            // Walk string backwards and trim any trailing whitespace
            while (namesize > 0 &&
                   (at[namesize - 1] == ' ' || at[namesize - 1] == '\t')) {
                namesize--;
            }

            char *value = malloc(namesize + 1);
            value[namesize] = 0;
            strncpy(value, at, namesize);
            return value;
        } else {
            return NULL;
        }
    }

    return NULL;
}